

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

ssize_t __thiscall
pugi::xml_writer_stream::write(xml_writer_stream *this,int __fd,void *__buf,size_t __n)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  
  pbVar1 = this->wide_stream;
  if (this->narrow_stream != (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
    if (pbVar1 == (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)0x0) {
      sVar2 = std::ostream::write((char *)this->narrow_stream,CONCAT44(in_register_00000034,__fd));
      return sVar2;
    }
    __assert_fail("!wide_stream",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x1434,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
  }
  if (pbVar1 == (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)0x0) {
    __assert_fail("wide_stream",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x1439,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
  }
  if (((ulong)__buf & 3) == 0) {
    sVar2 = std::wostream::write((wchar_t *)pbVar1,CONCAT44(in_register_00000034,__fd));
    return sVar2;
  }
  __assert_fail("size % sizeof(wchar_t) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                ,0x143a,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
}

Assistant:

PUGI_IMPL_FN void xml_writer_stream::write(const void* data, size_t size)
	{
		if (narrow_stream)
		{
			assert(!wide_stream);
			narrow_stream->write(reinterpret_cast<const char*>(data), static_cast<std::streamsize>(size));
		}
		else
		{
			assert(wide_stream);
			assert(size % sizeof(wchar_t) == 0);

			wide_stream->write(reinterpret_cast<const wchar_t*>(data), static_cast<std::streamsize>(size / sizeof(wchar_t)));
		}
	}